

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Neighbor_alltoallv
              (void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Datatype senddtype,void *recvbuf,
              int *recvcounts,int *rdispls,MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Neighbor_alltoallv();
  return iVar1;
}

Assistant:

int MPIABI_Neighbor_alltoallv(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  MPIABI_Datatype senddtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_alltoallv(
    sendbuf,
    sendcounts,
    sdispls,
    (MPI_Datatype)(WPI_Datatype)senddtype,
    recvbuf,
    recvcounts,
    rdispls,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}